

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfHeader.c
# Opt level: O1

_Bool headerIsValid(ThreefishKey_t *tf_key,chunk *header,uint64_t *file_size)

{
  size_t __nmemb;
  _Bool _Var1;
  uint64_t *header_00;
  
  if (header != (chunk *)0x0) {
    __nmemb = header->data_size;
    header_00 = (uint64_t *)calloc(__nmemb,1);
    if (header_00 != (uint64_t *)0x0) {
      memcpy(header_00,header->data,__nmemb);
      _Var1 = decryptHeader(tf_key,header_00);
      if (!_Var1) {
        return true;
      }
      _Var1 = checkHeader(header_00,file_size,(SkeinSize_t)tf_key->stateSize);
      if (_Var1) {
        header->action = '\x04';
        return true;
      }
      perror("Header check failed either password is incorrect or not a threefizer encrypted file\n"
            );
      return true;
    }
    perror("Error unable to allocate memory for header check\n");
  }
  return false;
}

Assistant:

bool headerIsValid(ThreefishKey_t* tf_key,
                   chunk* header,
                   uint64_t* file_size)
{
    if(header == NULL) { return false; }

    bool success = true;
    const uint64_t header_byte_size = header->data_size;

    //we make a copy of the header so we can pass just the header
    uint64_t* header_copy = calloc(header_byte_size, sizeof(uint8_t));

    if(header_copy == NULL)
    {
        perror("Error unable to allocate memory for header check\n");
        return false;
    }

    memcpy(header_copy, header->data, header_byte_size);

    if(decryptHeader(tf_key, header_copy))
    {
        if(checkHeader(header_copy, file_size, tf_key->stateSize))
        {
            header->action = GEN_MAC;
            success = true;
        }
        else
        {
            perror("Header check failed either password is incorrect or not a threefizer encrypted file\n");
        }
    }

    return success;
}